

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

char * __thiscall QLatin1::convertFromUnicode(QLatin1 *this,char *out,QStringView in,State *state)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  storage_type_conflict *psVar4;
  storage_type_conflict *psVar5;
  storage_type_conflict *psVar6;
  byte bVar7;
  ushort uVar8;
  
  uVar3 = *(uint *)in.m_size;
  psVar5 = (storage_type_conflict *)0x0;
  bVar7 = 0;
  if ((uVar3 & 2) == 0) {
    bVar7 = 0x3f;
  }
  if ((uVar3 & 1) != 0) {
    bVar7 = 0x3f;
  }
  psVar4 = in.m_data;
  if ((long)in.m_data < 1) {
    psVar4 = psVar5;
  }
  for (psVar6 = (storage_type_conflict *)0x0; psVar4 != psVar6;
      psVar6 = (storage_type_conflict *)((long)psVar6 + 1)) {
    uVar2 = *(ushort *)(out + (long)psVar6 * 2);
    uVar8 = uVar2;
    if (0xff < uVar2) {
      uVar8 = (ushort)bVar7;
    }
    psVar5 = (storage_type_conflict *)((long)psVar5 + (ulong)(0xff < uVar2));
    this[(long)psVar6] = SUB21(uVar8,0);
  }
  if ((uVar3 & 1) == 0) {
    puVar1 = (uint *)in.m_size + 4;
    *(long *)puVar1 = *(long *)puVar1 + (long)psVar5;
  }
  return (char *)(this + (long)psVar6);
}

Assistant:

char *QLatin1::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state) noexcept
{
    Q_ASSERT(state);
    if (state->flags & QStringConverter::Flag::Stateless) // temporary
        state = nullptr;

    const char replacement = (state && state->flags & QStringConverter::Flag::ConvertInvalidToNull) ? 0 : '?';
    qsizetype invalid = 0;
    for (qsizetype i = 0; i < in.size(); ++i) {
        if (in[i] > QChar(0xff)) {
            *out = replacement;
            ++invalid;
        } else {
            *out = (char)in[i].cell();
        }
        ++out;
    }
    if (state)
        state->invalidChars += invalid;
    return out;
}